

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O1

void Acec_ManDerive_rec(Gia_Man_t *pNew,Gia_Man_t *p,int Node,Vec_Int_t *vMirrors)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  
  if ((-1 < Node) && (Node < vMirrors->nSize)) {
    uVar16 = (uint)vMirrors->pArray[(uint)Node] >> 1;
    if (vMirrors->pArray[(uint)Node] < 0) {
      uVar16 = Node;
    }
    if (((int)uVar16 < 0) || (p->nObjs <= (int)uVar16)) {
LAB_00656d4e:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar1 = p->pObjs + uVar16;
    if (pGVar1->Value == 0xffffffff) {
      uVar7 = (uint)*(ulong *)pGVar1;
      if (((int)uVar7 < 0) || ((uVar7 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                      ,0x39,"void Acec_ManDerive_rec(Gia_Man_t *, Gia_Man_t *, int, Vec_Int_t *)");
      }
      Acec_ManDerive_rec(pNew,p,uVar16 - (uVar7 & 0x1fffffff),vMirrors);
      Acec_ManDerive_rec(pNew,p,uVar16 - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),vMirrors);
      uVar3 = *(ulong *)pGVar1;
      uVar8 = uVar3 & 0x1fffffff;
      uVar7 = (uint)(uVar3 >> 0x20);
      if ((uVar8 == 0x1fffffff || (int)(uint)uVar3 < 0) ||
         ((uVar7 & 0x1fffffff) <= ((uint)uVar3 & 0x1fffffff))) {
        if ((int)pGVar1[-uVar8].Value < 0) goto LAB_00656d6d;
        if ((int)pGVar1[-(ulong)(uVar7 & 0x1fffffff)].Value < 0) goto LAB_00656d6d;
        uVar7 = Gia_ManAppendAnd(pNew,pGVar1[-uVar8].Value ^ (uint)(uVar3 >> 0x1d) & 1,
                                 pGVar1[-(ulong)(uVar7 & 0x1fffffff)].Value ^ uVar7 >> 0x1d & 1);
      }
      else {
        uVar12 = pGVar1[-uVar8].Value;
        if ((int)uVar12 < 0) goto LAB_00656d6d;
        uVar14 = pGVar1[-(ulong)(uVar7 & 0x1fffffff)].Value;
        if ((int)uVar14 < 0) goto LAB_00656d6d;
        pGVar9 = Gia_ManAppendObj(pNew);
        uVar10 = uVar12 >> 1;
        iVar2 = pNew->nObjs;
        if (iVar2 <= (int)uVar10) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x2d4,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
        }
        uVar5 = uVar14 >> 1;
        if (iVar2 <= (int)uVar5) {
          __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x2d5,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
        }
        if (uVar10 == uVar5) {
          __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x2d6,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
        }
        uVar12 = uVar12 ^ (uint)(uVar3 >> 0x1d) & 7;
        uVar14 = uVar14 ^ uVar7 >> 0x1d;
        pGVar4 = pNew->pObjs;
        iVar6 = (int)pGVar9;
        if (uVar5 < uVar10) {
          if (pGVar4 + iVar2 <= pGVar9 || pGVar9 < pGVar4) goto LAB_00656dab;
          uVar3 = *(ulong *)pGVar9;
          uVar8 = (ulong)((uVar12 & 1) << 0x1d |
                         ((uint)(iVar6 - (int)pGVar4) >> 2) * -0x55555555 - uVar10 & 0x1fffffff);
          *(ulong *)pGVar9 = uVar8 | uVar3 & 0xffffffffc0000000;
          pGVar4 = pNew->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar9)) goto LAB_00656dab;
          uVar11 = (ulong)(((uint)(iVar6 - (int)pGVar4) >> 2) * -0x55555555 - uVar5 & 0x1fffffff) <<
                   0x20;
          *(ulong *)pGVar9 = uVar8 | uVar3 & 0xe0000000c0000000 | uVar11;
          uVar15 = (ulong)(uVar14 & 1) << 0x3d;
          uVar11 = uVar8 | uVar3 & 0xc0000000c0000000 | uVar11;
        }
        else {
          if (pGVar4 + iVar2 <= pGVar9 || pGVar9 < pGVar4) goto LAB_00656dab;
          uVar3 = *(ulong *)pGVar9;
          uVar13 = (ulong)(((uint)(iVar6 - (int)pGVar4) >> 2) * -0x55555555 - uVar10 & 0x1fffffff)
                   << 0x20;
          uVar8 = (ulong)(uVar12 & 1) << 0x3d;
          *(ulong *)pGVar9 = uVar8 | uVar3 & 0xc0000000ffffffff | uVar13;
          pGVar4 = pNew->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar9)) goto LAB_00656dab;
          uVar11 = (ulong)(((uint)(iVar6 - (int)pGVar4) >> 2) * -0x55555555 - uVar5 & 0x1fffffff);
          *(ulong *)pGVar9 = uVar8 | uVar3 & 0xc0000000e0000000 | uVar13 | uVar11;
          uVar15 = (ulong)((uVar14 & 1) << 0x1d);
          uVar11 = uVar8 | uVar3 & 0xc0000000c0000000 | uVar13 | uVar11;
        }
        *(ulong *)pGVar9 = uVar11 | uVar15;
        pNew->nXors = pNew->nXors + 1;
        pGVar4 = pNew->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar9)) {
LAB_00656dab:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar7 = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
      }
      pGVar1->Value = uVar7;
    }
    if (uVar16 != Node) {
      if (vMirrors->nSize <= Node) goto LAB_00656d2f;
      if (vMirrors->pArray[(uint)Node] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      if ((int)pGVar1->Value < 0) {
LAB_00656d6d:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      if (p->nObjs <= Node) goto LAB_00656d4e;
      p->pObjs[(uint)Node].Value = vMirrors->pArray[(uint)Node] & 1U ^ pGVar1->Value;
    }
    return;
  }
LAB_00656d2f:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////



////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Acec_ManDerive_rec( Gia_Man_t * pNew, Gia_Man_t * p, int Node, Vec_Int_t * vMirrors )
{
    Gia_Obj_t * pObj;
    int Obj = Node;
    if ( Vec_IntEntry(vMirrors, Node) >= 0 )
        Obj = Abc_Lit2Var( Vec_IntEntry(vMirrors, Node) );
    pObj = Gia_ManObj( p, Obj );
    if ( !~pObj->Value )
    {
        assert( Gia_ObjIsAnd(pObj) );
        Acec_ManDerive_rec( pNew, p, Gia_ObjFaninId0(pObj, Obj), vMirrors );
        Acec_ManDerive_rec( pNew, p, Gia_ObjFaninId1(pObj, Obj), vMirrors );
        if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXorReal( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    // set the original node as well
    if ( Obj != Node )
        Gia_ManObj(p, Node)->Value = Abc_LitNotCond( pObj->Value, Abc_LitIsCompl(Vec_IntEntry(vMirrors, Node)) );
}